

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void embree::printCommandLine(int argc,char **argv)

{
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < argc) {
    uVar4 = (ulong)(uint)argc;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,argv[uVar3]);
    pcVar2 = "";
    if ((long)uVar3 < (long)(argc + -1)) {
      pcVar2 = " ";
    }
    std::operator<<(poVar1,pcVar2);
  }
  if (0 < argc) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  return;
}

Assistant:

void printCommandLine(int argc, char** argv)
{
  for (int i = 0; i < argc; ++i)
      std::cout << argv[i] << (i < argc-1 ? " " : "");
  if (argc > 0) std::cout <<  std::endl;
}